

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O2

void __thiscall QIODevicePrivate::setWriteChannelCount(QIODevicePrivate *this,int count)

{
  QVarLengthArray<QRingBuffer,_1LL> *this_00;
  long lVar1;
  QRingBuffer *pQVar2;
  long sz;
  
  sz = (long)count;
  this_00 = &this->writeBuffers;
  lVar1 = (this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s;
  if (lVar1 < sz) {
    if (this->writeBufferChunkSize != 0) {
      QVarLengthArray<QRingBuffer,_1LL>::reserve(this_00,sz);
      while (lVar1 = (this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s,
            lVar1 < sz) {
        QVarLengthArray<QRingBuffer,1ll>::emplace_back<int&>
                  ((QVarLengthArray<QRingBuffer,1ll> *)this_00,&this->writeBufferChunkSize);
      }
    }
  }
  else {
    QVarLengthArray<QRingBuffer,_1LL>::resize(this_00,sz);
    lVar1 = (this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s;
  }
  this->writeChannelCount = count;
  pQVar2 = (QRingBuffer *)0x0;
  if (this->currentWriteChannel < lVar1) {
    pQVar2 = (QRingBuffer *)
             ((long)this->currentWriteChannel * 0x28 +
             (long)(this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.ptr);
  }
  (this->writeBuffer).m_buf = pQVar2;
  return;
}

Assistant:

void QIODevicePrivate::setWriteChannelCount(int count)
{
    if (count > writeBuffers.size()) {
        // If writeBufferChunkSize is zero (default value), we don't use
        // QIODevice's write buffers.
        if (writeBufferChunkSize != 0) {
            writeBuffers.reserve(count);
            while (writeBuffers.size() < count)
                writeBuffers.emplace_back(writeBufferChunkSize);
        }
    } else {
        writeBuffers.resize(count);
    }
    writeChannelCount = count;
    setCurrentWriteChannel(currentWriteChannel);
}